

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O3

idx_t __thiscall
duckdb::BufferPool::PurgeAgedBlocksInternal
          (BufferPool *this,EvictionQueue *queue,uint32_t max_age_sec,int64_t now,int64_t limit)

{
  _Atomic_word *p_Var1;
  long lVar2;
  __int_type _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  BlockHandle *pBVar7;
  type this_00;
  BlockLock lock;
  shared_ptr<duckdb::BlockHandle,_true> handle;
  BufferEvictionNode node;
  idx_t local_90;
  unique_lock<std::mutex> local_88;
  int64_t local_78;
  int64_t local_70;
  ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
  *local_68;
  undefined1 local_60 [24];
  BufferEvictionNode local_48;
  
  local_68 = &queue->q;
  local_90 = 0;
  local_78 = now;
  local_70 = limit;
  do {
    local_48.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_48.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar4 = duckdb_moodycamel::
            ConcurrentQueue<duckdb::BufferEvictionNode,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
            ::try_dequeue<duckdb::BufferEvictionNode>(local_68,&local_48);
    if (bVar4) {
LAB_01033364:
      BufferEvictionNode::TryGetBlockHandle((BufferEvictionNode *)local_60);
      if ((element_type *)local_60._0_8_ == (element_type *)0x0) {
        LOCK();
        (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
             (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
        UNLOCK();
        bVar4 = false;
      }
      else {
        pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                           ((shared_ptr<duckdb::BlockHandle,_true> *)local_60);
        local_88._M_device = &pBVar7->lock;
        local_88._M_owns = false;
        ::std::unique_lock<std::mutex>::lock(&local_88);
        local_88._M_owns = true;
        this_00 = shared_ptr<duckdb::BlockHandle,_true>::operator*
                            ((shared_ptr<duckdb::BlockHandle,_true> *)local_60);
        if (local_48.handle_sequence_number ==
            (this_00->eviction_seq_num).super___atomic_base<unsigned_long>._M_i) {
          bVar4 = BlockHandle::CanUnload(this_00);
          if (!bVar4) goto LAB_01033418;
          pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                             ((shared_ptr<duckdb::BlockHandle,_true> *)local_60);
          lVar2 = (pBVar7->lru_timestamp_msec).super___atomic_base<long>._M_i;
          bVar4 = local_70 <= lVar2;
          bVar5 = lVar2 <= local_78;
          pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                             ((shared_ptr<duckdb::BlockHandle,_true> *)local_60);
          _Var3 = (pBVar7->memory_usage).super___atomic_base<unsigned_long>._M_i;
          pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                             ((shared_ptr<duckdb::BlockHandle,_true> *)local_60);
          BlockHandle::UnloadAndTakeBlock((BlockHandle *)(local_60 + 0x10),(BlockLock *)pBVar7);
          if ((long *)local_60._16_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_60._16_8_ + 8))();
          }
          bVar4 = bVar4 && bVar5;
          local_90 = local_90 + _Var3;
        }
        else {
LAB_01033418:
          LOCK();
          (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i =
               (queue->total_dead_nodes).super___atomic_base<unsigned_long>._M_i - 1;
          UNLOCK();
          bVar4 = false;
        }
        ::std::unique_lock<std::mutex>::~unique_lock(&local_88);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      }
    }
    else {
      bVar5 = EvictionQueue::TryDequeueWithLock(queue,&local_48);
      bVar4 = true;
      if (bVar5) goto LAB_01033364;
    }
    if (local_48.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_48.handle.internal.
                   super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_weak_count;
        iVar6 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar6 = (local_48.handle.internal.
                 super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                )->_M_weak_count;
        (local_48.handle.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar6 + -1;
      }
      if (iVar6 == 1) {
        (*(local_48.handle.internal.
           super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[3])();
      }
    }
    if (bVar4) {
      return local_90;
    }
  } while( true );
}

Assistant:

idx_t BufferPool::PurgeAgedBlocksInternal(EvictionQueue &queue, uint32_t max_age_sec, int64_t now, int64_t limit) {
	idx_t purged_bytes = 0;
	queue.IterateUnloadableBlocks(
	    [&](BufferEvictionNode &node, const shared_ptr<BlockHandle> &handle, BlockLock &lock) {
		    // We will unload this block regardless. But stop the iteration immediately afterward if this
		    // block is younger than the age threshold.
		    auto lru_timestamp_msec = handle->GetLRUTimestamp();
		    bool is_fresh = lru_timestamp_msec >= limit && lru_timestamp_msec <= now;
		    purged_bytes += handle->GetMemoryUsage();
		    handle->Unload(lock);
		    // Return false to stop iterating if the current block is_fresh
		    return !is_fresh;
	    });
	return purged_bytes;
}